

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringFormat.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
rlib::string::format<char,unsigned_long_const&,std::__cxx11::string&,std::__cxx11::string_const&>
          (char *lpszFormat,unsigned_long *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string_type *in_stack_00000058;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> format;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *format_00;
  allocator<char> local_139;
  string local_138 [8];
  allocator<char> *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  pointer in_stack_ffffffffffffff08;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  
  format_00 = in_RDI;
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::exceptions
            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffef8,'\0');
  this = (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_139;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::parse
            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
             format.items_.
             super__Vector_base<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,in_stack_00000058);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  inner::f<char,unsigned_long_const,std::__cxx11::string&,std::__cxx11::string_const&>
            (format_00,(unsigned_long *)in_RDI,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,in_RSI);
  boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
            (in_stack_ffffffffffffff18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format(this);
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)format_00;
}

Assistant:

std::basic_string<CharT> format(const CharT* lpszFormat, Args&&... args) {
			boost::basic_format<CharT> format;
			format.exceptions(boost::io::no_error_bits);	// 例外を発生させない
			format.parse(lpszFormat);
			try {
				inner::f<CharT>(format, args...);
			} catch (...) {
			}
			return format.str();
		}